

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.h
# Opt level: O2

Config * jaegertracing::reporters::Config::parse(Config *__return_storage_ptr__,Node *configYAML)

{
  bool bVar1;
  int queueSize;
  int iVar2;
  char (*in_R8) [1];
  allocator local_7a;
  allocator local_79;
  duration local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> localAgentHostPort;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> endpoint;
  
  bVar1 = YAML::Node::IsDefined(configYAML);
  if (bVar1) {
    bVar1 = YAML::Node::IsMap(configYAML);
    if (bVar1) {
      localAgentHostPort._M_dataplus._M_p._0_4_ = 0;
      queueSize = utils::yaml::findOrDefault<int,char[10],int>
                            (configYAML,(char (*) [10])"queueSize",(int *)&localAgentHostPort);
      localAgentHostPort._M_dataplus._M_p._0_4_ = 0;
      iVar2 = utils::yaml::findOrDefault<int,char[20],int>
                        (configYAML,(char (*) [20])"bufferFlushInterval",(int *)&localAgentHostPort)
      ;
      localAgentHostPort._M_dataplus._M_p._0_4_ =
           (uint)localAgentHostPort._M_dataplus._M_p & 0xffffff00;
      bVar1 = utils::yaml::findOrDefault<bool,char[9],bool>
                        (configYAML,(char (*) [9])"logSpans",(bool *)&localAgentHostPort);
      utils::yaml::findOrDefault<std::__cxx11::string,char[19],char[1]>
                (&localAgentHostPort,(yaml *)configYAML,(Node *)"localAgentHostPort",
                 (char (*) [19])0x11304c,in_R8);
      utils::yaml::findOrDefault<std::__cxx11::string,char[9],char[1]>
                (&endpoint,(yaml *)configYAML,(Node *)"endpoint",(char (*) [9])0x11304c,in_R8);
      local_78.__r = (long)iVar2 * 1000000000;
      Config(__return_storage_ptr__,queueSize,&local_78,bVar1,&localAgentHostPort,&endpoint);
      goto LAB_0010e83d;
    }
  }
  local_78.__r = 10000000000;
  std::__cxx11::string::string((string *)&localAgentHostPort,"127.0.0.1:6831",&local_79);
  std::__cxx11::string::string((string *)&endpoint,"",&local_7a);
  Config(__return_storage_ptr__,100,&local_78,false,&localAgentHostPort,&endpoint);
LAB_0010e83d:
  std::__cxx11::string::~string((string *)&endpoint);
  std::__cxx11::string::~string((string *)&localAgentHostPort);
  return __return_storage_ptr__;
}

Assistant:

static Config parse(const YAML::Node& configYAML)
    {
        if (!configYAML.IsDefined() || !configYAML.IsMap()) {
            return Config();
        }

        const auto queueSize =
            utils::yaml::findOrDefault<int>(configYAML, "queueSize", 0);
        const auto bufferFlushInterval =
            std::chrono::seconds(utils::yaml::findOrDefault<int>(
                configYAML, "bufferFlushInterval", 0));
        const auto logSpans =
            utils::yaml::findOrDefault<bool>(configYAML, "logSpans", false);
        const auto localAgentHostPort = utils::yaml::findOrDefault<std::string>(
            configYAML, "localAgentHostPort", "");
        const auto endpoint = utils::yaml::findOrDefault<std::string>(
            configYAML, "endpoint", "");
        return Config(
            queueSize, bufferFlushInterval, logSpans, localAgentHostPort, endpoint);
    }